

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * HelpExampleCliNamed(string *__return_storage_ptr__,string *methodname,RPCArgList *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  byte *pbVar1;
  byte bVar2;
  pointer ppVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  byte *pbVar9;
  undefined8 uVar10;
  pointer __rhs;
  pointer pcVar11;
  long in_FS_OFFSET;
  bool bVar12;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  size_type *local_b8;
  size_type local_b0;
  size_type local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [72];
  pointer local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(__return_storage_ptr__,"> bitcoin-cli -named ",methodname);
  __rhs = (args->
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (args->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != ppVar3) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x40);
    do {
      if ((__rhs->second).typ == VSTR) {
        psVar6 = UniValue::get_str_abi_cxx11_(&__rhs->second);
        local_98._0_8_ = local_98 + 0x10;
        pcVar11 = (psVar6->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,pcVar11,pcVar11 + psVar6->_M_string_length);
      }
      else {
        UniValue::write_abi_cxx11_((UniValue *)local_98,(int)&__rhs->second,(void *)0x0,0);
      }
      std::operator+(&local_f8," ",&__rhs->first);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_f8,"=");
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if (paVar4 == paVar8) {
        local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_d8._M_dataplus._M_p = (pointer)paVar4;
      }
      local_d8._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      if ((pointer)local_98._8_8_ != (pointer)0x0) {
        pbVar1 = (byte *)(local_98._8_8_ + local_98._0_8_);
        bVar12 = false;
        pbVar9 = (byte *)local_98._0_8_;
        do {
          bVar2 = *pbVar9;
          if (((ulong)bVar2 < 0x28) && ((0x8500000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            local_98._64_8_ = &local_48;
            local_50 = (pointer)0x0;
            local_48._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                      (this,local_98._8_8_ * 2);
            uVar5 = local_98._8_8_;
            uVar10 = local_98._0_8_;
            if ((pointer)local_98._8_8_ != (pointer)0x0) {
              pcVar11 = (pointer)0x0;
              do {
                if (*(byte *)(uVar10 + (long)pcVar11) == 0x27) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(this,"\'\'\'");
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  push_back(this,*(byte *)(uVar10 + (long)pcVar11));
                }
                pcVar11 = pcVar11 + 1;
              } while ((pointer)uVar5 != pcVar11);
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_98 + 0x20),"\'",this);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_98 + 0x20),"\'");
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if (paVar4 == paVar8) {
              local_118.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            }
            else {
              local_118.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_118._M_dataplus._M_p = (pointer)paVar4;
            }
            local_118._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            if ((undefined1 *)local_98._32_8_ != local_98 + 0x30) {
              operator_delete((void *)local_98._32_8_,
                              (ulong)((long)&((_Alloc_hider *)local_98._48_8_)->_M_p + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._64_8_ != &local_48) {
              operator_delete((void *)local_98._64_8_,
                              CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]
                                      ) + 1);
            }
            if ((bVar2 < 0x28) && ((0x8500000000U >> ((ulong)(uint)bVar2 & 0x3f) & 1) != 0)) {
              if (!bVar12) goto LAB_006ccc54;
              break;
            }
          }
          pbVar9 = pbVar9 + 1;
          bVar12 = pbVar9 == pbVar1;
        } while (!bVar12);
      }
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_98._0_8_,(pointer)(local_98._8_8_ + local_98._0_8_));
LAB_006ccc54:
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        uVar10 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_118._M_string_length + local_d8._M_string_length) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          uVar10 = local_118.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_118._M_string_length + local_d8._M_string_length)
        goto LAB_006ccca4;
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_118,0,0,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      }
      else {
LAB_006ccca4:
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_d8,local_118._M_dataplus._M_p,local_118._M_string_length);
      }
      local_b8 = (size_type *)(pbVar7->_M_dataplus)._M_p;
      paVar4 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8 == paVar4) {
        local_a8 = paVar4->_M_allocated_capacity;
        uStack_a0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        local_b8 = &local_a8;
      }
      else {
        local_a8 = paVar4->_M_allocated_capacity;
      }
      local_b0 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar7->_M_string_length = 0;
      paVar4->_M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(char *)local_b8,local_b0);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != ppVar3);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"\n");
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HelpExampleCliNamed(const std::string& methodname, const RPCArgList& args)
{
    std::string result = "> bitcoin-cli -named " + methodname;
    for (const auto& argpair: args) {
        const auto& value = argpair.second.isStr()
                ? argpair.second.get_str()
                : argpair.second.write();
        result += " " + argpair.first + "=" + ShellQuoteIfNeeded(value);
    }
    result += "\n";
    return result;
}